

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
inipp::Format<char>::global_symbol
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Format<char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sec_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sec_name_local;
  Format<char> *this_local;
  
  local_28 = name;
  name_local = sec_name;
  sec_name_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_local = (Format<char> *)__return_storage_ptr__;
  std::operator+(&local_68,sec_name,this->char_interpol_sep);
  std::operator+(&local_48,&local_68,local_28);
  local_symbol(__return_storage_ptr__,this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<CharT> global_symbol(const std::basic_string<CharT>& sec_name, const std::basic_string<CharT>& name) const {
		return local_symbol(sec_name + char_interpol_sep + name);
	}